

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParserEntityCheck(xmlParserCtxtPtr ctxt,size_t size,xmlEntityPtr ent,size_t replacement)

{
  unsigned_long uVar1;
  xmlChar *str;
  xmlChar *pxVar2;
  long lVar3;
  xmlChar *rep;
  unsigned_long diff;
  unsigned_long oldnbent;
  size_t consumed;
  size_t replacement_local;
  xmlEntityPtr ent_local;
  size_t size_local;
  xmlParserCtxtPtr ctxt_local;
  
  oldnbent = 0;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || ((ctxt->options & 0x80000U) != 0)) {
    ctxt_local._4_4_ = 0;
  }
  else if ((ctxt->lastError).code == 0x59) {
    ctxt_local._4_4_ = 1;
  }
  else {
    if ((((ent != (xmlEntityPtr)0x0) && (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY)) &&
        (ent->content != (xmlChar *)0x0)) && ((ent->checked == 0 && (ctxt->errNo != 0x59)))) {
      uVar1 = ctxt->nbentities;
      ent->checked = 1;
      ctxt->depth = ctxt->depth + 1;
      str = xmlStringDecodeEntities(ctxt,ent->content,1,'\0','\0','\0');
      ctxt->depth = ctxt->depth + -1;
      if ((str == (xmlChar *)0x0) || (ctxt->errNo == 0x59)) {
        *ent->content = '\0';
      }
      rep = (xmlChar *)((ctxt->nbentities - uVar1) + 1);
      if ((xmlChar *)0x3fffffff < rep) {
        rep = (xmlChar *)0x3fffffff;
      }
      ent->checked = (int)((long)rep << 1);
      if (str != (xmlChar *)0x0) {
        pxVar2 = xmlStrchr(str,'<');
        if (pxVar2 != (xmlChar *)0x0) {
          ent->checked = ent->checked | 1;
        }
        (*xmlFree)(str);
      }
    }
    if (replacement == 0) {
      if (size == 0) {
        if (ent == (xmlEntityPtr)0x0) {
          if ((((ctxt->lastError).code != 0x1a) && ((ctxt->lastError).code != 0x1b)) ||
             (ctxt->nbentities < 0x2711)) {
            return 0;
          }
        }
        else {
          if (ctxt->input != (xmlParserInputPtr)0x0) {
            oldnbent = (unsigned_long)
                       (ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
          }
          if ((ulong)((long)(ent->checked / 2) * 3) < (ctxt->sizeentities + oldnbent) * 10) {
            return 0;
          }
        }
      }
      else {
        if (size < 1000) {
          return 0;
        }
        if (ctxt->input != (xmlParserInputPtr)0x0) {
          oldnbent = (unsigned_long)
                     (ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
        }
        lVar3 = ctxt->sizeentities + oldnbent;
        if ((size < (ulong)(lVar3 * 10)) && (ctxt->nbentities * 3 < (ulong)(lVar3 * 10))) {
          return 0;
        }
      }
    }
    else {
      if (replacement < 10000000) {
        return 0;
      }
      if (ctxt->input != (xmlParserInputPtr)0x0) {
        oldnbent = (unsigned_long)
                   (ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
      }
      if (replacement < (ctxt->sizeentities + oldnbent) * 10) {
        return 0;
      }
    }
    xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
    ctxt_local._4_4_ = 1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlParserEntityCheck(xmlParserCtxtPtr ctxt, size_t size,
                     xmlEntityPtr ent, size_t replacement)
{
    size_t consumed = 0;

    if ((ctxt == NULL) || (ctxt->options & XML_PARSE_HUGE))
        return (0);
    if (ctxt->lastError.code == XML_ERR_ENTITY_LOOP)
        return (1);

    /*
     * This may look absurd but is needed to detect
     * entities problems
     */
    if ((ent != NULL) && (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
	(ent->content != NULL) && (ent->checked == 0) &&
	(ctxt->errNo != XML_ERR_ENTITY_LOOP)) {
	unsigned long oldnbent = ctxt->nbentities, diff;
	xmlChar *rep;

	ent->checked = 1;

        ++ctxt->depth;
	rep = xmlStringDecodeEntities(ctxt, ent->content,
				  XML_SUBSTITUTE_REF, 0, 0, 0);
        --ctxt->depth;
	if ((rep == NULL) || (ctxt->errNo == XML_ERR_ENTITY_LOOP)) {
	    ent->content[0] = 0;
	}

        diff = ctxt->nbentities - oldnbent + 1;
        if (diff > INT_MAX / 2)
            diff = INT_MAX / 2;
	ent->checked = diff * 2;
	if (rep != NULL) {
	    if (xmlStrchr(rep, '<'))
		ent->checked |= 1;
	    xmlFree(rep);
	    rep = NULL;
	}
    }
    if (replacement != 0) {
	if (replacement < XML_MAX_TEXT_LENGTH)
	    return(0);

        /*
	 * If the volume of entity copy reaches 10 times the
	 * amount of parsed data and over the large text threshold
	 * then that's very likely to be an abuse.
	 */
        if (ctxt->input != NULL) {
	    consumed = ctxt->input->consumed +
	               (ctxt->input->cur - ctxt->input->base);
	}
        consumed += ctxt->sizeentities;

        if (replacement < XML_PARSER_NON_LINEAR * consumed)
	    return(0);
    } else if (size != 0) {
        /*
         * Do the check based on the replacement size of the entity
         */
        if (size < XML_PARSER_BIG_ENTITY)
	    return(0);

        /*
         * A limit on the amount of text data reasonably used
         */
        if (ctxt->input != NULL) {
            consumed = ctxt->input->consumed +
                (ctxt->input->cur - ctxt->input->base);
        }
        consumed += ctxt->sizeentities;

        if ((size < XML_PARSER_NON_LINEAR * consumed) &&
	    (ctxt->nbentities * 3 < XML_PARSER_NON_LINEAR * consumed))
            return (0);
    } else if (ent != NULL) {
        /*
         * use the number of parsed entities in the replacement
         */
        size = ent->checked / 2;

        /*
         * The amount of data parsed counting entities size only once
         */
        if (ctxt->input != NULL) {
            consumed = ctxt->input->consumed +
                (ctxt->input->cur - ctxt->input->base);
        }
        consumed += ctxt->sizeentities;

        /*
         * Check the density of entities for the amount of data
	 * knowing an entity reference will take at least 3 bytes
         */
        if (size * 3 < consumed * XML_PARSER_NON_LINEAR)
            return (0);
    } else {
        /*
         * strange we got no data for checking
         */
	if (((ctxt->lastError.code != XML_ERR_UNDECLARED_ENTITY) &&
	     (ctxt->lastError.code != XML_WAR_UNDECLARED_ENTITY)) ||
	    (ctxt->nbentities <= 10000))
	    return (0);
    }
    xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
    return (1);
}